

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

void cfl_luma_subsampling_444_hbd_avx2
               (uint16_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  __m256i top_1;
  __m256i top;
  __m256i *row_end;
  __m256i *row;
  undefined8 *local_158;
  undefined1 (*local_138) [32];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  local_158 = in_RDX;
  local_138 = in_RDI;
  do {
    auVar2 = local_138[1];
    auVar1 = vpsllw_avx2(*local_138,ZEXT416(3));
    local_e0 = auVar1._0_8_;
    uStack_d8 = auVar1._8_8_;
    uStack_d0 = auVar1._16_8_;
    uStack_c8 = auVar1._24_8_;
    *local_158 = local_e0;
    local_158[1] = uStack_d8;
    local_158[2] = uStack_d0;
    local_158[3] = uStack_c8;
    auVar1 = vpsllw_avx2(auVar2,ZEXT416(3));
    local_120 = auVar1._0_8_;
    uStack_118 = auVar1._8_8_;
    uStack_110 = auVar1._16_8_;
    uStack_108 = auVar1._24_8_;
    local_158[4] = local_120;
    local_158[5] = uStack_118;
    local_158[6] = uStack_110;
    local_158[7] = uStack_108;
    local_138 = (undefined1 (*) [32])(*local_138 + (long)in_ESI * 2);
    local_158 = local_158 + 8;
  } while (local_158 < in_RDX + (long)(in_R8D << 1) * 4);
  return;
}

Assistant:

static void cfl_luma_subsampling_444_hbd_avx2(const uint16_t *input,
                                              int input_stride,
                                              uint16_t *pred_buf_q3, int width,
                                              int height) {
  (void)width;  // Forever 32
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;
  do {
    __m256i top = _mm256_loadu_si256((__m256i *)input);
    __m256i top_1 = _mm256_loadu_si256((__m256i *)(input + 16));
    _mm256_storeu_si256(row, _mm256_slli_epi16(top, 3));
    _mm256_storeu_si256(row + 1, _mm256_slli_epi16(top_1, 3));
    input += input_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}